

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.h
# Opt level: O0

bool __thiscall
draco::DecoderBuffer::BitDecoder::GetBits(BitDecoder *this,uint32_t nbits,uint32_t *x)

{
  int iVar1;
  uint *in_RDX;
  uint in_ESI;
  BitDecoder *in_RDI;
  uint32_t bit;
  uint32_t value;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 local_1;
  
  if (in_ESI < 0x21) {
    local_24 = 0;
    for (local_28 = 0; local_28 < in_ESI; local_28 = local_28 + 1) {
      iVar1 = GetBit(in_RDI);
      local_24 = iVar1 << ((byte)local_28 & 0x1f) | local_24;
    }
    *in_RDX = local_24;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool GetBits(uint32_t nbits, uint32_t *x) {
      if (nbits > 32) {
        return false;
      }
      uint32_t value = 0;
      for (uint32_t bit = 0; bit < nbits; ++bit) {
        value |= GetBit() << bit;
      }
      *x = value;
      return true;
    }